

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O0

void PrintFileProcessingProgress(Context *context)

{
  FILE *__stream;
  char *pcVar1;
  Context *context_local;
  
  __stream = _stderr;
  pcVar1 = PrintablePath(context->current_input_path);
  fprintf(__stream,"[%s]: ",pcVar1);
  PrintBytes(context->total_in);
  fprintf(_stderr," -> ");
  PrintBytes(context->total_out);
  return;
}

Assistant:

static void PrintFileProcessingProgress(Context* context) {
  fprintf(stderr, "[%s]: ", PrintablePath(context->current_input_path));
  PrintBytes(context->total_in);
  fprintf(stderr, " -> ");
  PrintBytes(context->total_out);
}